

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

char * parasail_pack_fastq_buffer(char *T,off_t size,long *packed_size)

{
  char cVar1;
  bool bVar2;
  parasail_file_stat_t *__ptr;
  parasail_file_stat_t *ppVar3;
  off_t oVar4;
  long lVar5;
  long lVar6;
  char *__ptr_00;
  ulong uVar7;
  size_t sStack_40;
  
  if (T == (char *)0x0) {
    __ptr_00 = "parasail_pack_fastq_buffer: NULL pointer\n";
    sStack_40 = 0x29;
  }
  else {
    if (packed_size == (long *)0x0) {
      __ptr_00 = "parasail_pack_fastq_buffer: NULL size pointer\n";
    }
    else {
      __ptr = parasail_stat_fastq_buffer(T,size);
      if (__ptr != (parasail_file_stat_t *)0x0) {
        ppVar3 = (parasail_file_stat_t *)malloc(__ptr->characters + __ptr->sequences + 1);
        if (ppVar3 == (parasail_file_stat_t *)0x0) {
          perror("malloc");
          fwrite("parasail_pack_fastq_buffer: malloc failed\n",0x2a,1,_stderr);
        }
        else {
          free(__ptr);
          bVar2 = false;
          oVar4 = 0;
          lVar6 = 0;
          uVar7 = 0;
          while( true ) {
            if (size <= oVar4) {
              *(undefined2 *)((long)&ppVar3->sequences + lVar6) = 0x24;
              *packed_size = lVar6 + 1;
              return (char *)ppVar3;
            }
            if (T[oVar4] != '@') break;
            if (bVar2) {
              *(undefined1 *)((long)&ppVar3->sequences + lVar6) = 0x24;
              lVar6 = lVar6 + 1;
            }
            oVar4 = skip_line(T,oVar4);
            for (lVar5 = oVar4 + 2; (cVar1 = T[lVar5 + -1], cVar1 != '\n' && (cVar1 != '\r'));
                lVar5 = lVar5 + 1) {
              *(char *)((long)&ppVar3->sequences + lVar6) = cVar1;
              lVar6 = lVar6 + 1;
            }
            if ((size <= lVar5) || ((T[lVar5] != '\n' && (T[lVar5] != '\r')))) {
              lVar5 = lVar5 + -1;
            }
            if (T[lVar5 + 1] != '+') {
              uVar7 = uVar7 | 2;
              break;
            }
            oVar4 = skip_line(T,lVar5 + 1);
            oVar4 = skip_line(T,oVar4 + 1);
            oVar4 = oVar4 + 1;
            uVar7 = uVar7 + 4;
            bVar2 = true;
          }
          fprintf(_stderr,"parasail_pack_fastq_buffer: poorly formatted FASTQ file, line %lu\n",
                  uVar7);
          __ptr = ppVar3;
        }
        free(__ptr);
        return (char *)0x0;
      }
      __ptr_00 = "parasail_stat_fastq_buffer: fastq stat failed\n";
    }
    sStack_40 = 0x2e;
  }
  fwrite(__ptr_00,sStack_40,1,_stderr);
  return (char *)0x0;
}

Assistant:

char * parasail_pack_fastq_buffer(const char *T, off_t size, long * packed_size)
{
    char *P = NULL;
    int first = 1;
    off_t i = 0;
    off_t w = 0;
    unsigned long line = 0;
    parasail_file_stat_t *pfs = NULL;

    if (NULL == T) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL pointer\n");
        return NULL;
    }

    if (NULL == packed_size) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL size pointer\n");
        return NULL;
    }

    pfs = parasail_stat_fastq_buffer(T, size);
    if (NULL == pfs) {
        fprintf(stderr, "parasail_stat_fastq_buffer: fastq stat failed\n");
        return NULL;
    }

    P = (char*)malloc(sizeof(char) * (pfs->characters+pfs->sequences+1));
    if (NULL == P) {
        perror("malloc");
        fprintf(stderr, "parasail_pack_fastq_buffer: malloc failed\n");
        free(pfs);
        return NULL;
    }
    free(pfs);

    /* read file */
    while (i<size) {
        if (T[i] != '@') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        /* encountered a new sequence */
        if (first) {
            first = 0;
        }
        else {
            P[w++] = '$';
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line is the sequence */
        while (T[i] != '\n' && T[i] != '\r') {
            P[w++] = T[i];
            ++i;
        }

        /* for the case of "\r\n" or "\n\r" */
        if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
            ++i;
        }

        /* go to next line */
        ++i;
        ++line;

        if (T[i] != '+') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line are the quality control values */
        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;
    }

    P[w++] = '$';
    P[w] = '\0';
    *packed_size = w;
    return P;
}